

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acutest.h
# Opt level: O0

int test_lookup_(char *pattern)

{
  int iVar1;
  char *pcVar2;
  int local_20;
  int local_1c;
  int n;
  int i;
  char *pattern_local;
  
  local_20 = 0;
  local_1c = 0;
  do {
    if ((int)test_list_size_ <= local_1c) {
LAB_00106beb:
      if (local_20 == 0) {
        for (local_1c = 0; local_1c < (int)test_list_size_; local_1c = local_1c + 1) {
          iVar1 = test_name_contains_word_(test_list_[local_1c].name,pattern);
          if (iVar1 != 0) {
            test_remember_(local_1c);
            local_20 = local_20 + 1;
          }
        }
        if (local_20 < 1) {
          for (local_1c = 0; local_1c < (int)test_list_size_; local_1c = local_1c + 1) {
            pcVar2 = strstr(test_list_[local_1c].name,pattern);
            if (pcVar2 != (char *)0x0) {
              test_remember_(local_1c);
              local_20 = local_20 + 1;
            }
          }
          pattern_local._4_4_ = local_20;
        }
        else {
          pattern_local._4_4_ = local_20;
        }
      }
      else {
        pattern_local._4_4_ = local_20;
      }
      return pattern_local._4_4_;
    }
    iVar1 = strcmp(test_list_[local_1c].name,pattern);
    if (iVar1 == 0) {
      test_remember_(local_1c);
      local_20 = 1;
      goto LAB_00106beb;
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

static int
test_lookup_(const char* pattern)
{
    int i;
    int n = 0;

    /* Try exact match. */
    for(i = 0; i < (int) test_list_size_; i++) {
        if(strcmp(test_list_[i].name, pattern) == 0) {
            test_remember_(i);
            n++;
            break;
        }
    }
    if(n > 0)
        return n;

    /* Try word match. */
    for(i = 0; i < (int) test_list_size_; i++) {
        if(test_name_contains_word_(test_list_[i].name, pattern)) {
            test_remember_(i);
            n++;
        }
    }
    if(n > 0)
        return n;

    /* Try relaxed match. */
    for(i = 0; i < (int) test_list_size_; i++) {
        if(strstr(test_list_[i].name, pattern) != NULL) {
            test_remember_(i);
            n++;
        }
    }

    return n;
}